

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O3

CURLcode Curl_urldecode(Curl_easy *data,char *string,size_t length,char **ostring,size_t *olen,
                       _Bool reject_ctrl)

{
  size_t sVar1;
  byte bVar2;
  int iVar3;
  CURLcode CVar4;
  char *pcVar5;
  ulong ulnum;
  size_t sVar6;
  undefined3 in_register_00000089;
  char hexstr [3];
  char *ptr;
  byte local_57;
  byte local_56;
  undefined1 local_55;
  undefined4 local_54;
  char **local_50;
  size_t *local_48;
  byte *local_40;
  char *local_38;
  
  local_54 = CONCAT31(in_register_00000089,reject_ctrl);
  local_48 = olen;
  if (length == 0) {
    length = strlen(string);
  }
  pcVar5 = (char *)(*Curl_cmalloc)(length + 1);
  if (pcVar5 == (char *)0x0) {
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar6 = 0;
    sVar1 = length + 1;
    local_50 = ostring;
    for (; length != 0; length = length - 1) {
      bVar2 = *string;
      if ((length < 3) || (bVar2 != 0x25)) {
LAB_00450fa8:
        if (((char)local_54 != '\0') && (bVar2 < 0x20)) {
          (*Curl_cfree)(pcVar5);
          return CURLE_URL_MALFORMAT;
        }
      }
      else {
        iVar3 = Curl_isxdigit((uint)((byte *)string)[1]);
        bVar2 = 0x25;
        if ((iVar3 != 0) && (iVar3 = Curl_isxdigit((uint)((byte *)string)[2]), iVar3 != 0)) {
          local_40 = (byte *)string + 2;
          local_57 = ((byte *)string)[1];
          local_56 = ((byte *)string)[2];
          local_55 = 0;
          ulnum = strtoul((char *)&local_57,&local_38,0x10);
          bVar2 = curlx_ultouc(ulnum);
          length = sVar1 - 3;
          string = (char *)local_40;
          goto LAB_00450fa8;
        }
      }
      pcVar5[sVar6] = bVar2;
      sVar6 = sVar6 + 1;
      string = (char *)((byte *)string + 1);
      sVar1 = length;
    }
    pcVar5[sVar6] = '\0';
    if (local_48 != (size_t *)0x0) {
      *local_48 = sVar6;
    }
    *local_50 = pcVar5;
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

CURLcode Curl_urldecode(struct Curl_easy *data,
                        const char *string, size_t length,
                        char **ostring, size_t *olen,
                        bool reject_ctrl)
{
  size_t alloc = (length?length:strlen(string)) + 1;
  char *ns = malloc(alloc);
  size_t strindex = 0;
  unsigned long hex;
  CURLcode result = CURLE_OK;

  if(!ns)
    return CURLE_OUT_OF_MEMORY;

  while(--alloc > 0) {
    unsigned char in = *string;
    if(('%' == in) && (alloc > 2) &&
       ISXDIGIT(string[1]) && ISXDIGIT(string[2])) {
      /* this is two hexadecimal digits following a '%' */
      char hexstr[3];
      char *ptr;
      hexstr[0] = string[1];
      hexstr[1] = string[2];
      hexstr[2] = 0;

      hex = strtoul(hexstr, &ptr, 16);

      in = curlx_ultouc(hex); /* this long is never bigger than 255 anyway */

      if(data) {
        result = Curl_convert_from_network(data, (char *)&in, 1);
        if(result) {
          /* Curl_convert_from_network calls failf if unsuccessful */
          free(ns);
          return result;
        }
      }

      string += 2;
      alloc -= 2;
    }

    if(reject_ctrl && (in < 0x20)) {
      free(ns);
      return CURLE_URL_MALFORMAT;
    }

    ns[strindex++] = in;
    string++;
  }
  ns[strindex] = 0; /* terminate it */

  if(olen)
    /* store output size */
    *olen = strindex;

  /* store output string */
  *ostring = ns;

  return CURLE_OK;
}